

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_delete.hpp
# Opt level: O2

void boost::checked_delete<boost::runtime::cla::rt_cla_detail::parameter_trie>(parameter_trie *x)

{
  if (x != (parameter_trie *)0x0) {
    runtime::cla::rt_cla_detail::parameter_trie::~parameter_trie(x);
  }
  operator_delete(x,0x60);
  return;
}

Assistant:

inline void checked_delete(T * x)
{
    // intentionally complex - simplification causes regressions
    typedef char type_must_be_complete[ sizeof(T)? 1: -1 ];
    (void) sizeof(type_must_be_complete);
    delete x;
}